

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

int av1_setup_sms_tree(AV1_COMP *cpi,ThreadData_conflict *td)

{
  int iVar1;
  uint is_sb_size_128_00;
  int iVar2;
  void *pvVar3;
  BLOCK_SIZE *pBVar4;
  long in_RSI;
  AV1_COMP *in_RDI;
  SIMPLE_MOTION_DATA_TREE *tree_2;
  int j;
  SIMPLE_MOTION_DATA_TREE *tree_1;
  int i;
  SIMPLE_MOTION_DATA_TREE *tree;
  int leaf_nodes;
  int leaf_factor;
  int nodes;
  int square_index;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int sms_tree_index;
  int tree_nodes;
  int is_sb_size_128;
  int stat_generation_stage;
  AV1_COMMON *cm;
  void *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_54;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_4;
  
  if ((in_RDI->oxcf).kf_cfg.key_freq_max == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = is_stat_generation_stage(in_RDI);
    is_sb_size_128_00 = (uint)(((in_RDI->common).seq_params)->sb_size == BLOCK_128X128);
    iVar2 = av1_get_pc_tree_nodes(is_sb_size_128_00,iVar1);
    local_3c = 1;
    aom_free(in_stack_ffffffffffffff90);
    pvVar3 = aom_calloc(CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (size_t)in_stack_ffffffffffffff90);
    *(void **)(in_RSI + 0x25ca8) = pvVar3;
    if (*(long *)(in_RSI + 0x25ca8) == 0) {
      local_4 = -1;
    }
    else {
      local_38 = *(undefined8 *)(in_RSI + 0x25ca8);
      if (iVar1 == 0) {
        local_40 = 1;
        if (is_sb_size_128_00 != 0) {
          local_40 = 4;
        }
        local_40 = local_40 << 8;
        for (local_30 = 0; local_30 < local_40; local_30 = local_30 + 1) {
          *(undefined1 *)(*(long *)(in_RSI + 0x25ca8) + (long)local_30 * 0x78) = 0;
        }
        while (local_40 = local_40 >> 2, local_40 != 0) {
          for (local_54 = 0; local_54 < local_40; local_54 = local_54 + 1) {
            pBVar4 = (BLOCK_SIZE *)(*(long *)(in_RSI + 0x25ca8) + (long)local_30 * 0x78);
            *pBVar4 = square[local_3c];
            for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
              *(undefined8 *)(pBVar4 + (long)iVar1 * 8 + 8) = local_38;
              local_38 = local_38 + 0x78;
            }
            local_30 = local_30 + 1;
          }
          local_3c = local_3c + 1;
        }
      }
      else {
        **(BLOCK_SIZE **)(in_RSI + 0x25ca8) = BLOCK_16X16;
      }
      *(long *)(in_RSI + 0x25cb0) = *(long *)(in_RSI + 0x25ca8) + (long)(iVar2 + -1) * 0x78;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int av1_setup_sms_tree(AV1_COMP *const cpi, ThreadData *td) {
  // The structure 'sms_tree' is used to store the simple motion search data for
  // partition pruning in inter frames. Hence, the memory allocations and
  // initializations related to it are avoided for allintra encoding mode.
  if (cpi->oxcf.kf_cfg.key_freq_max == 0) return 0;

  AV1_COMMON *const cm = &cpi->common;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  int sms_tree_index = 0;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int square_index = 1;
  int nodes;

  aom_free(td->sms_tree);
  td->sms_tree =
      (SIMPLE_MOTION_DATA_TREE *)aom_calloc(tree_nodes, sizeof(*td->sms_tree));
  if (!td->sms_tree) return -1;
  this_sms = &td->sms_tree[0];

  if (!stat_generation_stage) {
    const int leaf_factor = is_sb_size_128 ? 4 : 1;
    const int leaf_nodes = 256 * leaf_factor;

    // Sets up all the leaf nodes in the tree.
    for (sms_tree_index = 0; sms_tree_index < leaf_nodes; ++sms_tree_index) {
      SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
      tree->block_size = square[0];
    }

    // Each node has 4 leaf nodes, fill each block_size level of the tree
    // from leafs to the root.
    for (nodes = leaf_nodes >> 2; nodes > 0; nodes >>= 2) {
      for (int i = 0; i < nodes; ++i) {
        SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
        tree->block_size = square[square_index];
        for (int j = 0; j < 4; j++) tree->split[j] = this_sms++;
        ++sms_tree_index;
      }
      ++square_index;
    }
  } else {
    // Allocation for firstpass/LAP stage
    // TODO(Mufaddal): refactor square_index to use a common block_size macro
    // from firstpass.c
    SIMPLE_MOTION_DATA_TREE *const tree = &td->sms_tree[sms_tree_index];
    square_index = 2;
    tree->block_size = square[square_index];
  }

  // Set up the root node for the largest superblock size
  td->sms_root = &td->sms_tree[tree_nodes - 1];
  return 0;
}